

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

void __thiscall
ws::Record::Record(Record *this,time_point time_point_,Severity severity_,source_location location_)

{
  size_t sVar1;
  id local_30;
  hash<std::thread::id> local_25;
  Severity local_24;
  Record *pRStack_20;
  Severity severity__local;
  Record *this_local;
  source_location location__local;
  time_point time_point__local;
  
  (this->time_point).__d.__r = (rep)time_point_.__d.__r;
  this->severity = severity_;
  local_24 = severity_;
  pRStack_20 = this;
  this_local = (Record *)location_._M_impl;
  location__local._M_impl = (__impl *)time_point_.__d.__r;
  local_30 = std::this_thread::get_id();
  sVar1 = std::hash<std::thread::id>::operator()(&local_25,&local_30);
  this->thread_id = sVar1;
  (this->location)._M_impl = (__impl *)this_local;
  std::__cxx11::string::string((string *)&this->message);
  return;
}

Assistant:

Record(std::chrono::system_clock::time_point time_point_, Severity severity_,
           std::source_location location_)
        : time_point(time_point_), severity(severity_), location(location_),
          thread_id(std::hash<std::thread::id>{}(std::this_thread::get_id()))
    {
    }